

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O1

void __thiscall
phmap::priv::
btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_std::greater<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
::decrement_slow(btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_std::greater<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
                 *this)

{
  btree_node<phmap::priv::map_params<int,_int,_std::greater<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
  bVar1;
  uint uVar2;
  btree_node<phmap::priv::map_params<int,_int,_std::greater<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
  *pbVar3;
  undefined8 uVar4;
  bool bVar5;
  btree_node<phmap::priv::map_params<int,_int,_std::greater<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
  *pbVar6;
  btree_node<phmap::priv::map_params<int,_int,_std::greater<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
  *pbVar7;
  char *__function;
  size_type i;
  btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_std::greater<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
  save;
  int iStack_10;
  
  pbVar7 = this->node;
  if (((ulong)pbVar7 & 7) != 0) {
LAB_0028db6b:
    __function = 
    "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::map_params<int, int, std::greater<int>, std::allocator<std::pair<const int, int>>, 256, true>> *, unsigned char, phmap::priv::map_slot_type<int, int>, phmap::priv::btree_node<phmap::priv::map_params<int, int, std::greater<int>, std::allocator<std::pair<const int, int>>, 256, true>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::map_params<int, int, std::greater<int>, std::allocator<std::pair<const int, int>>, 256, true>> *, unsigned char, phmap::priv::map_slot_type<int, int>, phmap::priv::btree_node<phmap::priv::map_params<int, int, std::greater<int>, std::allocator<std::pair<const int, int>>, 256, true>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 1UL, Char = const char]"
    ;
LAB_0028db80:
    __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                  ,0xf84,__function);
  }
  uVar2 = this->position;
  i = (size_type)uVar2;
  if (pbVar7[0xb] ==
      (btree_node<phmap::priv::map_params<int,_int,_std::greater<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
       )0x0) {
    if ((int)uVar2 < 0) {
      __assert_fail("position >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                    ,0x994,
                    "void phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int, int, std::greater<int>, std::allocator<std::pair<const int, int>>, 256, true>>, std::pair<const int, int> &, std::pair<const int, int> *>::decrement_slow() [Node = phmap::priv::btree_node<phmap::priv::map_params<int, int, std::greater<int>, std::allocator<std::pair<const int, int>>, 256, true>>, Reference = std::pair<const int, int> &, Pointer = std::pair<const int, int> *]"
                   );
    }
    do {
      pbVar7 = btree_node<phmap::priv::map_params<int,_int,_std::greater<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
               ::child(pbVar7,i);
      this->node = pbVar7;
      if (((ulong)pbVar7 & 7) != 0) goto LAB_0028db6b;
      i = (size_type)(byte)pbVar7[10];
    } while (pbVar7[0xb] ==
             (btree_node<phmap::priv::map_params<int,_int,_std::greater<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
              )0x0);
    this->position = (byte)pbVar7[10] - 1;
  }
  else {
    if (-1 < (int)uVar2) {
      __assert_fail("position <= -1",
                    "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                    ,0x989,
                    "void phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int, int, std::greater<int>, std::allocator<std::pair<const int, int>>, 256, true>>, std::pair<const int, int> &, std::pair<const int, int> *>::decrement_slow() [Node = phmap::priv::btree_node<phmap::priv::map_params<int, int, std::greater<int>, std::allocator<std::pair<const int, int>>, 256, true>>, Reference = std::pair<const int, int> &, Pointer = std::pair<const int, int> *]"
                   );
    }
    pbVar7 = this->node;
    uVar4 = *(undefined8 *)&this->position;
    if (this->position < 0) {
      do {
        bVar5 = btree_node<phmap::priv::map_params<int,_int,_std::greater<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
                ::is_root(this->node);
        if (bVar5) break;
        pbVar3 = this->node;
        if (((ulong)pbVar3 & 7) != 0) {
          __function = 
          "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::map_params<int, int, std::greater<int>, std::allocator<std::pair<const int, int>>, 256, true>> *, unsigned char, phmap::priv::map_slot_type<int, int>, phmap::priv::btree_node<phmap::priv::map_params<int, int, std::greater<int>, std::allocator<std::pair<const int, int>>, 256, true>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::map_params<int, int, std::greater<int>, std::allocator<std::pair<const int, int>>, 256, true>> *, unsigned char, phmap::priv::map_slot_type<int, int>, phmap::priv::btree_node<phmap::priv::map_params<int, int, std::greater<int>, std::allocator<std::pair<const int, int>>, 256, true>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 0UL, Char = const char]"
          ;
          goto LAB_0028db80;
        }
        pbVar6 = btree_node<phmap::priv::map_params<int,_int,_std::greater<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
                 ::child(*(btree_node<phmap::priv::map_params<int,_int,_std::greater<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
                           **)pbVar3,(ulong)(byte)pbVar3[8]);
        pbVar3 = this->node;
        if (pbVar6 != pbVar3) {
          __assert_fail("node->parent()->child(node->position()) == node",
                        "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                        ,0x98c,
                        "void phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int, int, std::greater<int>, std::allocator<std::pair<const int, int>>, 256, true>>, std::pair<const int, int> &, std::pair<const int, int> *>::decrement_slow() [Node = phmap::priv::btree_node<phmap::priv::map_params<int, int, std::greater<int>, std::allocator<std::pair<const int, int>>, 256, true>>, Reference = std::pair<const int, int> &, Pointer = std::pair<const int, int> *]"
                       );
        }
        if (((ulong)pbVar3 & 7) != 0) goto LAB_0028db6b;
        bVar1 = pbVar3[8];
        this->position = (byte)bVar1 - 1;
        this->node = *(btree_node<phmap::priv::map_params<int,_int,_std::greater<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
                       **)pbVar3;
      } while (bVar1 == (btree_node<phmap::priv::map_params<int,_int,_std::greater<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
                         )0x0);
    }
    if (this->position < 0) {
      iStack_10 = (int)uVar4;
      this->position = iStack_10;
      this->node = pbVar7;
    }
  }
  return;
}

Assistant:

void btree_iterator<N, R, P>::decrement_slow() {
        if (node->leaf()) {
            assert(position <= -1);
            btree_iterator save(*this);
            while (position < 0 && !node->is_root()) {
                assert(node->parent()->child(node->position()) == node);
                position = node->position() - 1;
                node = node->parent();
            }
            if (position < 0) {
                *this = save;
            }
        } else {
            assert(position >= 0);
            node = node->child(position);
            while (!node->leaf()) {
                node = node->child(node->count());
            }
            position = node->count() - 1;
        }
    }